

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,GeomBasisCurves *geom,uint32_t indent,
          bool closing_brace)

{
  optional<tinyusdz::Interpolation> oVar1;
  undefined8 uVar2;
  bool bVar3;
  ostream *poVar4;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar5;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  undefined3 in_register_00000081;
  uint32_t uVar6;
  uint indent_00;
  stringstream ss;
  string local_210;
  undefined1 local_1f0 [56];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar6 = CONCAT31(in_register_00000081,closing_brace);
  local_1f0._36_4_ = indent;
  local_1f0._48_8_ = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)geom & 0xffffffff),n);
  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  to_string_abi_cxx11_((string *)local_1f0,(tinyusdz *)(ulong)*(uint *)(this + 0xa98),s);
  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)local_1f0._0_8_,local_1f0._8_8_);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," BasisCurves \"",0xe);
  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,*(char **)(this + 0xa78),*(long *)(this + 0xa80));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
  oVar1 = (optional<tinyusdz::Interpolation>)((long)local_1f0 + 0x10);
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  bVar3 = PrimMetas::authored((PrimMetas *)(this + 0x1a10));
  uVar5 = n_00;
  if (bVar3) {
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)geom & 0xffffffff),n_00);
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    print_prim_metas_abi_cxx11_(&local_210,this + 0x1a10,(PrimMeta *)(ulong)((int)geom + 1),indent);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    uVar5 = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      uVar5 = extraout_EDX_00;
    }
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)geom & 0xffffffff),uVar5);
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
    uVar5 = extraout_EDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      uVar5 = extraout_EDX_02;
    }
  }
  pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)geom & 0xffffffff),uVar5);
  poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  local_1f0._0_8_ = oVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"type","");
  indent_00 = (int)geom + 1;
  local_1f0._40_8_ = (pprint *)((ulong)geom & 0xffffffff);
  print_typed_token_attr<tinyusdz::GeomBasisCurves::Type>
            (&local_210,
             (TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Type> *)(this + 0x1e68),
             (string *)local_1f0,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"basis","");
  print_typed_token_attr<tinyusdz::GeomBasisCurves::Basis>
            (&local_210,
             (TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Basis> *)(this + 0x20a0),
             (string *)local_1f0,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"wrap","");
  print_typed_token_attr<tinyusdz::GeomBasisCurves::Wrap>
            (&local_210,
             (TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Wrap> *)(this + 0x22d8),
             (string *)local_1f0,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"points","");
  print_typed_attr<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
            (&local_210,this + 0x2510,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
              *)local_1f0,(string *)(ulong)indent_00,uVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"normals","");
  print_typed_attr<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
            (&local_210,this + 0x2788,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
              *)local_1f0,(string *)(ulong)indent_00,uVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"widths","");
  print_typed_attr<std::vector<float,std::allocator<float>>>
            (&local_210,this + 0x2c78,
             (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *)
             local_1f0,(string *)(ulong)indent_00,uVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"velocites","");
  print_typed_attr<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            (&local_210,this + 0x2ef0,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
              *)local_1f0,(string *)(ulong)indent_00,uVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"accelerations","");
  print_typed_attr<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            (&local_210,this + 0x3168,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
              *)local_1f0,(string *)(ulong)indent_00,uVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = oVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"curveVertexCounts","");
  print_typed_attr<std::vector<int,std::allocator<int>>>
            (&local_210,this + 0x2a00,
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_1f0,(string *)(ulong)indent_00,uVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  uVar2 = local_1f0._40_8_;
  if ((optional<tinyusdz::Interpolation>)local_1f0._0_8_ != oVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  print_gprim_predefined<tinyusdz::GeomBasisCurves>(&local_210,(GeomBasisCurves *)this,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  print_props(&local_210,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0x1970),indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
  uVar6 = extraout_EDX_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    uVar6 = extraout_EDX_04;
  }
  if (local_1f0[0x24] != '\0') {
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)(uVar2 & 0xffffffff),uVar6);
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
  }
  uVar2 = local_1f0._48_8_;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return (string *)uVar2;
}

Assistant:

std::string to_string(const GeomBasisCurves &geom, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(geom.spec) << " BasisCurves \""
     << geom.name << "\"\n";
  if (geom.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(geom.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  ss << print_typed_token_attr(geom.type, "type", indent + 1);
  ss << print_typed_token_attr(geom.basis, "basis", indent + 1);
  ss << print_typed_token_attr(geom.wrap, "wrap", indent + 1);

  ss << print_typed_attr(geom.points, "points", indent + 1);
  ss << print_typed_attr(geom.normals, "normals", indent + 1);
  ss << print_typed_attr(geom.widths, "widths", indent + 1);
  ss << print_typed_attr(geom.velocities, "velocites", indent + 1);
  ss << print_typed_attr(geom.accelerations, "accelerations", indent + 1);
  ss << print_typed_attr(geom.curveVertexCounts, "curveVertexCounts",
                         indent + 1);

  ss << print_gprim_predefined(geom, indent + 1);

  ss << print_props(geom.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}